

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

double * r8row_min(int m,int n,double *a)

{
  double *pdVar1;
  double *pdVar2;
  ulong uVar3;
  long lVar4;
  double *pdVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  
  uVar6 = (ulong)(uint)m;
  uVar3 = 0xffffffffffffffff;
  if (-1 < m) {
    uVar3 = uVar6 * 8;
  }
  pdVar1 = (double *)operator_new__(uVar3);
  if (0 < m) {
    pdVar2 = a + uVar6;
    uVar3 = 0;
    do {
      dVar7 = a[uVar3];
      pdVar1[uVar3] = dVar7;
      lVar4 = (ulong)(uint)n - 1;
      pdVar5 = pdVar2;
      if (1 < n) {
        do {
          dVar8 = *pdVar5;
          if (dVar7 <= *pdVar5) {
            dVar8 = dVar7;
          }
          lVar4 = lVar4 + -1;
          pdVar5 = pdVar5 + uVar6;
          dVar7 = dVar8;
        } while (lVar4 != 0);
        pdVar1[uVar3] = dVar8;
      }
      uVar3 = uVar3 + 1;
      pdVar2 = pdVar2 + 1;
    } while (uVar3 != uVar6);
  }
  return pdVar1;
}

Assistant:

double *r8row_min ( int m, int n, double a[] )

//****************************************************************************80
//
//  Purpose:
//
//    R8ROW_MIN returns the minimums of an R8ROW.
//
//  Example:
//
//    A =
//      1  2  3
//      2  6  7
//
//    MIN =
//      1
//      2
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    29 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int M, N, the number of rows and columns in the array.
//
//    Input, double A[M*N], the array to be examined.
//
//    Output, double R8ROW_MIN[M], the minimums of the rows.
//
{
  int i;
  int j;
  double *amin;

  amin = new double[m];

  for ( i = 0; i < m; i++ )
  {
    amin[i] = a[i+0*m];
    for ( j = 1; j < n; j++ )
    {
      if ( a[i+j*m] < amin[i] )
      {
        amin[i] = a[i+j*m];
      }
    }
  }

  return amin;
}